

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall
UKF::PredictMeanAndCovariance(UKF *this,MatrixXd *Xsig_pred,VectorXd *x_out,MatrixXd *P_out)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  DenseIndex DVar3;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pPVar4;
  int iVar5;
  Index size;
  ulong uVar6;
  long lVar7;
  MatrixXd *pMVar8;
  Matrix<double,_1,1,0,_1,1> *pMVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  VectorXd x_diff;
  Matrix<double,_1,1,0,_1,1> *local_a8;
  MatrixXd *local_a0;
  Matrix<double,_1,1,0,_1,1> *local_98;
  MatrixXd *local_90;
  MatrixXd *pMStack_88;
  Matrix<double,_1,1,0,_1,1> *local_80;
  double local_78;
  void *local_68;
  long local_60;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_58;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_50;
  MatrixXd *local_48;
  PlainObject *local_40;
  
  local_58 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P_out;
  local_50 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)x_out;
  if (PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
      ::x == '\0') {
    iVar5 = __cxa_guard_acquire(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                                 ::x);
    if (iVar5 != 0) {
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&PredictMeanAndCovariance::x,(long)this->n_x_);
      __cxa_atexit(Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~PlainObjectBase
                   ,&PredictMeanAndCovariance::x,&__dso_handle);
      __cxa_guard_release(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                           ::x);
    }
  }
  if (PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
      ::P == '\0') {
    iVar5 = __cxa_guard_acquire(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                                 ::P);
    if (iVar5 != 0) {
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,0,_1,_1> *)&PredictMeanAndCovariance::P,&this->n_x_,
                 &this->n_x_);
      __cxa_atexit(Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
                   ~PlainObjectBase,&PredictMeanAndCovariance::P,&__dso_handle);
      __cxa_guard_release(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                           ::P);
    }
  }
  local_a8 = (Matrix<double,_1,1,0,_1,1> *)
             PredictMeanAndCovariance::x.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_98 = (Matrix<double,_1,1,0,_1,1> *)0x0;
  if (PredictMeanAndCovariance::x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows < 0) {
    pcVar11 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
LAB_0010894d:
    local_98 = (Matrix<double,_1,1,0,_1,1> *)0x0;
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,pcVar11);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&PredictMeanAndCovariance::x,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_a8);
  DVar3 = PredictMeanAndCovariance::x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_storage.m_rows;
  if ((Matrix<double,_1,1,0,_1,1> *)
      PredictMeanAndCovariance::x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows == local_a8) {
    uVar6 = PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
            (PredictMeanAndCovariance::x.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows >> 0x3f
            ) & 0xfffffffffffffffe;
    if (1 < PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      lVar12 = 0;
      do {
        pdVar1 = PredictMeanAndCovariance::x.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 lVar12;
        *pdVar1 = (double)local_98;
        pdVar1[1] = (double)local_98;
        lVar12 = lVar12 + 2;
      } while (lVar12 < (long)uVar6);
    }
    pdVar1 = PredictMeanAndCovariance::x.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    auVar16 = _DAT_00118060;
    auVar2 = _DAT_00118050;
    lVar12 = DVar3 % 2;
    if (lVar12 != 0 && (long)uVar6 <= DVar3) {
      lVar7 = lVar12 + -1;
      auVar15._8_4_ = (int)lVar7;
      auVar15._0_8_ = lVar7;
      auVar15._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar6 = 0;
      auVar15 = auVar15 ^ _DAT_00118060;
      do {
        auVar17._8_4_ = (int)uVar6;
        auVar17._0_8_ = uVar6;
        auVar17._12_4_ = (int)(uVar6 >> 0x20);
        auVar17 = (auVar17 | auVar2) ^ auVar16;
        if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                    auVar15._4_4_ < auVar17._4_4_) & 1)) {
          pdVar1[(DVar3 / 2) * 2 + uVar6] = (double)local_98;
        }
        if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
            auVar17._12_4_ <= auVar15._12_4_) {
          pdVar1[(DVar3 / 2) * 2 + uVar6 + 1] = (double)local_98;
        }
        uVar6 = uVar6 + 2;
      } while ((lVar12 + 1U & 0xfffffffffffffffe) != uVar6);
    }
    if (-1 < this->n_aug_) {
      lVar12 = 0;
      do {
        if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar12) goto LAB_0010879b;
        pMVar9 = (Matrix<double,_1,1,0,_1,1> *)
                 (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows;
        pMVar8 = (MatrixXd *)
                 ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_data + (long)pMVar9 * lVar12);
        if ((long)pMVar9 < 0 && pMVar8 != (MatrixXd *)0x0) goto LAB_001087d9;
        if ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar12) goto LAB_001087ba;
        local_78 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[lVar12];
        local_a8 = (Matrix<double,_1,1,0,_1,1> *)&PredictMeanAndCovariance::x;
        local_a0 = pMVar8;
        local_98 = pMVar9;
        pMStack_88 = Xsig_pred;
        local_80 = pMVar9;
        if ((Matrix<double,_1,1,0,_1,1> *)
            PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            pMVar9) {
          pcVar11 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
          ;
          goto LAB_0010885a;
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                   &PredictMeanAndCovariance::x,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                    *)&local_a8);
        DVar3 = PredictMeanAndCovariance::x.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if ((Matrix<double,_1,1,0,_1,1> *)
            PredictMeanAndCovariance::x.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            local_98) {
          pcVar11 = 
          "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
          ;
          goto LAB_00108824;
        }
        uVar6 = PredictMeanAndCovariance::x.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
                (PredictMeanAndCovariance::x.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows >>
                0x3f) & 0xfffffffffffffffe;
        if (1 < PredictMeanAndCovariance::x.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          lVar7 = 0;
          do {
            pdVar1 = (double *)(*(long *)local_a8 + lVar7 * 8);
            auVar2 = *(undefined1 (*) [16])
                      (&(local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                        .m_storage.m_data + lVar7);
            auVar16._0_8_ = local_78 * auVar2._0_8_ + *pdVar1;
            auVar16._8_8_ = local_78 * auVar2._8_8_ + pdVar1[1];
            *(undefined1 (*) [16])
             (PredictMeanAndCovariance::x.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar7) = auVar16;
            lVar7 = lVar7 + 2;
          } while (lVar7 < (long)uVar6);
        }
        pdVar1 = PredictMeanAndCovariance::x.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if ((long)uVar6 < DVar3) {
          lVar7 = *(long *)local_a8;
          do {
            pdVar1[uVar6] =
                 (double)(&(local_a0->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data)[uVar6] * local_78 + *(double *)(lVar7 + uVar6 * 8);
            uVar6 = uVar6 + 1;
          } while (DVar3 != uVar6);
        }
        bVar13 = SBORROW8(lVar12,(long)this->n_aug_ * 2);
        lVar7 = lVar12 + (long)this->n_aug_ * -2;
        lVar12 = lVar12 + 1;
      } while (bVar13 != lVar7 < 0);
    }
    local_a8 = (Matrix<double,_1,1,0,_1,1> *)
               PredictMeanAndCovariance::P.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_a0 = (MatrixXd *)
               PredictMeanAndCovariance::P.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    local_98 = (Matrix<double,_1,1,0,_1,1> *)0x0;
    if ((PredictMeanAndCovariance::P.
         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols |
        PredictMeanAndCovariance::P.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_storage.m_rows) < 0) {
      pcVar11 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_0010894d;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&PredictMeanAndCovariance::P,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_a8);
    if (-1 < this->n_aug_) {
      lVar12 = 0;
      do {
        pMVar8 = (MatrixXd *)
                 (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows;
        pMVar9 = (Matrix<double,_1,1,0,_1,1> *)
                 ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_data + (long)pMVar8 * lVar12);
        if ((long)pMVar8 < 0 && pMVar9 != (Matrix<double,_1,1,0,_1,1> *)0x0) {
LAB_001087d9:
          __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/MapBase.h"
                        ,0x94,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                       );
        }
        if ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar12) {
LAB_001087ba:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Block.h"
                        ,0x76,
                        "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                       );
        }
        local_80 = (Matrix<double,_1,1,0,_1,1> *)&PredictMeanAndCovariance::x;
        local_a8 = pMVar9;
        local_a0 = pMVar8;
        local_90 = Xsig_pred;
        pMStack_88 = pMVar8;
        if (pMVar8 != (MatrixXd *)
                      PredictMeanAndCovariance::x.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows) {
          pcVar11 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
LAB_0010885a:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CwiseBinaryOp.h"
                        ,0x84,pcVar11);
        }
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((Matrix<double,_1,1,0,_1,1> *)&local_68,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_a8);
        if (local_60 < 4) {
LAB_0010879b:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x18a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar14 = *(double *)((long)local_68 + 0x18);
        if (3.141592653589793 < dVar14) {
          do {
            dVar14 = dVar14 + -6.283185307179586;
          } while (3.141592653589793 < dVar14);
          *(double *)((long)local_68 + 0x18) = dVar14;
        }
        if (dVar14 < -3.141592653589793) {
          do {
            dVar14 = dVar14 + 6.283185307179586;
          } while (dVar14 < -3.141592653589793);
          *(double *)((long)local_68 + 0x18) = dVar14;
        }
        if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar12) goto LAB_0010879b;
        local_a0 = (MatrixXd *)
                   (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[lVar12];
        local_90 = (MatrixXd *)0x0;
        pMStack_88 = (MatrixXd *)0x0;
        local_80 = (Matrix<double,_1,1,0,_1,1> *)0x0;
        local_48 = &PredictMeanAndCovariance::P;
        local_a8 = (Matrix<double,_1,1,0,_1,1> *)&local_68;
        local_98 = (Matrix<double,_1,1,0,_1,1> *)&local_68;
        local_40 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_a8);
        if ((PredictMeanAndCovariance::P.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
             *(long *)(local_a8 + 8)) ||
           (PredictMeanAndCovariance::P.
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols !=
            *(long *)(local_98 + 8))) {
          pcVar11 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
          ;
          goto LAB_0010885a;
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                   &PredictMeanAndCovariance::P,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                    *)&local_48);
        free(local_90);
        free(local_68);
        bVar13 = SBORROW8(lVar12,(long)this->n_aug_ * 2);
        lVar7 = lVar12 + (long)this->n_aug_ * -2;
        lVar12 = lVar12 + 1;
      } while (bVar13 != lVar7 < 0);
    }
    pPVar4 = local_50;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_50,(EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        &PredictMeanAndCovariance::x);
    uVar6 = *(ulong *)(pPVar4 + 8);
    if (uVar6 == PredictMeanAndCovariance::x.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      uVar10 = uVar6 - ((long)uVar6 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar6) {
        lVar12 = 0;
        do {
          dVar14 = (PredictMeanAndCovariance::x.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + lVar12)[1];
          pdVar1 = (double *)(*(long *)pPVar4 + lVar12 * 8);
          *pdVar1 = PredictMeanAndCovariance::x.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    [lVar12];
          pdVar1[1] = dVar14;
          lVar12 = lVar12 + 2;
        } while (lVar12 < (long)uVar10);
      }
      pdVar1 = PredictMeanAndCovariance::x.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if ((long)uVar10 < (long)uVar6) {
        lVar12 = *(long *)pPVar4;
        do {
          *(double *)(lVar12 + uVar10 * 8) = pdVar1[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (local_58,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          &PredictMeanAndCovariance::P);
      return;
    }
    pcVar11 = 
    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    pcVar11 = 
    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
    ;
  }
LAB_00108824:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar11);
}

Assistant:

void UKF::PredictMeanAndCovariance(const MatrixXd &Xsig_pred, VectorXd &x_out, MatrixXd &P_out) {
 
  //create vector for predicted state
  static VectorXd x = VectorXd(n_x_);

  //create covariance matrix for prediction
  static MatrixXd P = MatrixXd(n_x_, n_x_);

  //predicted state mean
  x.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points
    x = x + weights_(i) * Xsig_pred.col(i);
  }

  //predicted state covariance matrix
  P.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points

    // state difference
    VectorXd x_diff = Xsig_pred.col(i) - x;
    //angle normalization
    while (x_diff(3)> M_PI) x_diff(3)-=2.*M_PI;
    while (x_diff(3)<-M_PI) x_diff(3)+=2.*M_PI;

    P = P + weights_(i) * x_diff * x_diff.transpose() ;

  }

  //print result
  //std::cout << "Predicted state px,py,v,psi,psi_dot" << std::endl;
  //std::cout << x << std::endl;
  //std::cout << "Predicted covariance matrix P " << std::endl;
  //std::cout << P << std::endl;

  //write result
  x_out = x;
  P_out = P;

  return;
}